

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall QConfFileSettingsPrivate::clear(QConfFileSettingsPrivate *this)

{
  QMutex *this_00;
  __pointer_type copy;
  QConfFile *confFile;
  bool bVar1;
  
  if ((this->confFiles).d.size == 0) {
    return;
  }
  confFile = *(this->confFiles).d.ptr;
  this_00 = &confFile->mutex;
  if ((confFile->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar1 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar1) {
      (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar1) goto LAB_0043925f;
  }
  QBasicMutex::lockInternal(&this_00->super_QBasicMutex);
LAB_0043925f:
  ensureAllSectionsParsed(this,confFile);
  QMap<QSettingsKey,_QVariant>::clear(&confFile->addedKeys);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>_>
  ::operator=(&(confFile->removedKeys).d,&(confFile->originalKeys).d);
  LOCK();
  copy = (confFile->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
  (confFile->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy == (__pointer_type)0x1) {
    return;
  }
  QBasicMutex::unlockInternalFutex(&this_00->super_QBasicMutex,copy);
  return;
}

Assistant:

constexpr bool isEmpty() const noexcept { return size() == 0; }